

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
S2RegionTermIndexer::GetIndexTerms_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,S2RegionTermIndexer *this,S2Point *point,string_view prefix)

{
  undefined4 uVar1;
  int iVar2;
  string_view prefix_00;
  uint64 local_78;
  undefined1 local_70 [56];
  int level;
  S2CellId id;
  S2Point *point_local;
  S2RegionTermIndexer *this_local;
  string_view prefix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *terms;
  
  id.id_ = (uint64)point;
  S2CellId::S2CellId((S2CellId *)&level,point);
  local_70[0x37] = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  for (local_70._48_4_ = S2RegionCoverer::Options::min_level((Options *)this);
      uVar1 = local_70._48_4_, iVar2 = S2RegionCoverer::Options::max_level((Options *)this),
      (int)uVar1 <= iVar2; local_70._48_4_ = iVar2 + local_70._48_4_) {
    local_78 = (uint64)S2CellId::parent((S2CellId *)&level,local_70._48_4_);
    prefix_00.length_ = (size_type)prefix.ptr_;
    prefix_00.ptr_ = (char *)&local_78;
    GetTerm_abi_cxx11_((S2RegionTermIndexer *)local_70,(TermType)this,(S2CellId *)0x0,prefix_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    iVar2 = S2RegionCoverer::Options::level_mod((Options *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> S2RegionTermIndexer::GetIndexTerms(const S2Point& point,
                                                  string_view prefix) {
  // See the top of this file for an overview of the indexing strategy.
  //
  // The last cell generated by this loop is effectively the covering for
  // the given point.  You might expect that this cell would be indexed as a
  // covering term, but as an optimization we always index these cells as
  // ancestor terms only.  This is possible because query regions will never
  // contain a descendant of such cells.  Note that this is true even when
  // max_level() != true_max_level() (see S2RegionCoverer::Options).

  const S2CellId id(point);
  vector<string> terms;
  for (int level = options_.min_level(); level <= options_.max_level();
       level += options_.level_mod()) {
    terms.push_back(GetTerm(TermType::ANCESTOR, id.parent(level), prefix));
  }
  return terms;
}